

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SliceDynamicLayerParams::SliceDynamicLayerParams
          (SliceDynamicLayerParams *this,SliceDynamicLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SliceDynamicLayerParams_00729088
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->beginmasks_).current_size_ = 0;
  (this->beginmasks_).total_size_ = 0;
  (this->beginmasks_).rep_ = (Rep *)0x0;
  iVar1 = (from->beginmasks_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<bool>::Reserve(&this->beginmasks_,iVar1);
    memcpy(((this->beginmasks_).rep_)->elements,((from->beginmasks_).rep_)->elements,
           (long)(from->beginmasks_).current_size_);
    (this->beginmasks_).current_size_ = (from->beginmasks_).current_size_;
  }
  (this->endids_).current_size_ = 0;
  (this->endids_).total_size_ = 0;
  (this->endids_).rep_ = (Rep *)0x0;
  iVar1 = (from->endids_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<long>::Reserve(&this->endids_,iVar1);
    memcpy(((this->endids_).rep_)->elements,((from->endids_).rep_)->elements,
           (long)(from->endids_).current_size_ << 3);
    (this->endids_).current_size_ = (from->endids_).current_size_;
  }
  (this->endmasks_).current_size_ = 0;
  (this->endmasks_).total_size_ = 0;
  (this->endmasks_).rep_ = (Rep *)0x0;
  iVar1 = (from->endmasks_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<bool>::Reserve(&this->endmasks_,iVar1);
    memcpy(((this->endmasks_).rep_)->elements,((from->endmasks_).rep_)->elements,
           (long)(from->endmasks_).current_size_);
    (this->endmasks_).current_size_ = (from->endmasks_).current_size_;
  }
  (this->strides_).current_size_ = 0;
  (this->strides_).total_size_ = 0;
  (this->strides_).rep_ = (Rep *)0x0;
  iVar1 = (from->strides_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<long>::Reserve(&this->strides_,iVar1);
    memcpy(((this->strides_).rep_)->elements,((from->strides_).rep_)->elements,
           (long)(from->strides_).current_size_ << 3);
    (this->strides_).current_size_ = (from->strides_).current_size_;
  }
  (this->squeezemasks_).current_size_ = 0;
  (this->squeezemasks_).total_size_ = 0;
  (this->squeezemasks_).rep_ = (Rep *)0x0;
  iVar1 = (from->squeezemasks_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<bool>::Reserve(&this->squeezemasks_,iVar1);
    memcpy(((this->squeezemasks_).rep_)->elements,((from->squeezemasks_).rep_)->elements,
           (long)(from->squeezemasks_).current_size_);
    (this->squeezemasks_).current_size_ = (from->squeezemasks_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

SliceDynamicLayerParams::SliceDynamicLayerParams(const SliceDynamicLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      beginmasks_(from.beginmasks_),
      endids_(from.endids_),
      endmasks_(from.endmasks_),
      strides_(from.strides_),
      squeezemasks_(from.squeezemasks_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SliceDynamicLayerParams)
}